

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::expand
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *this)

{
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *this_00;
  ulong *in_RDI;
  size_t i;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *newStack;
  void *mem;
  size_t newCapacity;
  ulong local_38;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar1;
  
  if (*in_RDI == 0) {
    local_38 = 8;
  }
  else {
    local_38 = *in_RDI << 1;
  }
  this_00 = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)Lib::alloc((size_t)in_RDI);
  if (*in_RDI != 0) {
    for (pMVar1 = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
        pMVar1 < (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)*in_RDI;
        pMVar1 = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                 ((long)&(pMVar1->numeral)._val[0]._mp_alloc + 1)) {
      Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Monom(this_00,pMVar1);
      Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~Monom
                ((Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x376a6a);
    }
    Lib::free((void *)in_RDI[1]);
  }
  in_RDI[1] = (ulong)this_00;
  in_RDI[2] = in_RDI[1] + *in_RDI * 0x20;
  in_RDI[3] = in_RDI[1] + local_38 * 0x20;
  *in_RDI = local_38;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }